

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O0

bool __thiscall CoreML::RangeValue::operator>=(RangeValue *this,RangeValue *other)

{
  ulong uVar1;
  bool bVar2;
  size_t sVar3;
  RangeValue *other_local;
  RangeValue *this_local;
  
  if ((this->_isUnbound & 1U) == 0) {
    bVar2 = isUnbound(other);
    if (bVar2) {
      this_local._7_1_ = false;
    }
    else {
      uVar1 = this->_val;
      sVar3 = value(other);
      this_local._7_1_ = sVar3 <= uVar1;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool RangeValue::operator>= (const RangeValue& other) const {
    if (_isUnbound)
        return true;
    else if (other.isUnbound())
        return false;
    else
        return _val >= other.value();
}